

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  double *pdVar1;
  bool bVar2;
  AssertHelper *this_00;
  Particle<(pica::Dimension)1> *in_RDI;
  double dVar3;
  FP FVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MomentumType v;
  MomentumType newVelocity;
  ParticleType particle;
  AssertHelper *in_stack_fffffffffffffee0;
  FP3 *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Particle<(pica::Dimension)1> *in_stack_ffffffffffffff00;
  Type in_stack_ffffffffffffff0c;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_ffffffffffffff10;
  AssertionResult local_d8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  AssertHelper *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  Vector3<double> local_58 [3];
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
            (in_stack_ffffffffffffff10);
  pica::Vector3<double>::Vector3(local_58,5243.1654,-5623000.0,-0.0065237);
  pica::Particle<(pica::Dimension)1>::setVelocity
            (in_stack_ffffffffffffff00,
             (MomentumType *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  (in_RDI->p).z = 1e-12;
  pica::Particle<(pica::Dimension)1>::getVelocity(in_RDI);
  dVar3 = pica::Vector3<double>::norm((Vector3<double> *)0x2018d7);
  pdVar1 = &(in_RDI->p).y;
  if (dVar3 < *pdVar1 || dVar3 == *pdVar1) {
    pica::Particle<(pica::Dimension)1>::getVelocity(in_RDI);
    pica::dist((FP3 *)in_RDI,in_stack_fffffffffffffee8);
    testing::internal::CmpHelperLE<double,double>
              ((char *)in_stack_ffffffffffffff88.ptr_,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff10);
      testing::AssertionResult::failure_message((AssertionResult *)0x201af5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 (char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(char *)in_RDI);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,
                 (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
      testing::Message::~Message((Message *)0x201b41);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x201ba1);
  }
  else {
    pica::Particle<(pica::Dimension)1>::getVelocity(in_RDI);
    FVar4 = pica::dist((FP3 *)in_RDI,in_stack_fffffffffffffee8);
    dVar3 = pica::Vector3<double>::norm((Vector3<double> *)0x201924);
    testing::internal::CmpHelperLE<double,double>
              ((char *)in_stack_ffffffffffffff88.ptr_,in_stack_ffffffffffffff80,
               (double *)(FVar4 / dVar3),in_stack_ffffffffffffff70);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff80);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff10);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x20199a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 (char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(char *)in_RDI);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff40,
                 (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x2019ee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x201a54);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}